

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_strlike(char *zPattern,char *zStr,uint esc)

{
  long in_RSI;
  long in_RDI;
  u32 in_stack_00000024;
  compareInfo *in_stack_00000028;
  u8 *in_stack_00000038;
  u8 *in_stack_00000040;
  undefined4 local_4;
  
  if (in_RSI == 0) {
    local_4 = (uint)(in_RDI != 0);
  }
  else if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    local_4 = patternCompare(in_stack_00000040,in_stack_00000038,in_stack_00000028,in_stack_00000024
                            );
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_strlike(const char *zPattern, const char *zStr, unsigned int esc){
  if( zStr==0 ){
    return zPattern!=0;
  }else if( zPattern==0 ){
    return 1;
  }else{
    return patternCompare((u8*)zPattern, (u8*)zStr, &likeInfoNorm, esc);
  }
}